

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Invert(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  size_t sVar10;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  uint32_t size;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 in_XMM0_Qb;
  undefined1 auVar20 [16];
  PLSample PVar21;
  float param_weight [4];
  ulong local_80;
  undefined1 local_78 [16];
  float local_68 [6];
  Float *local_50;
  anon_class_24_3_14863758 local_48;
  
  iVar9 = 0;
  local_50 = param;
  for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
    if ((ulong)this->m_param_size[local_80] == 1) {
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_68 + local_80 * 2) = uVar1;
    }
    else {
      local_48.this = this;
      local_48.dim = &local_80;
      local_48.param = &local_50;
      sVar10 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Invert(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_1_>
                         ((ulong)this->m_param_size[local_80],&local_48);
      pfVar4 = (this->m_param_values).ptr[local_80].ptr;
      fVar19 = pfVar4[sVar10 & 0xffffffff];
      auVar20 = ZEXT416((uint)((local_50[local_80] - fVar19) / (pfVar4[(int)sVar10 + 1] - fVar19)));
      auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
      uVar1 = vcmpss_avx512f(auVar20,ZEXT816(0) << 0x40,1);
      fVar19 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar5._0_4_);
      local_68[local_80 * 2 + 1] = fVar19;
      local_68[local_80 * 2] = 1.0 - fVar19;
      iVar9 = (int)sVar10 * this->m_param_strides[local_80] + iVar9;
    }
  }
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  iVar13 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar2 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  fVar19 = sample.super_Tuple2<pbrt::Vector2,_float>.x *
           (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  iVar3 = iVar2 + -2;
  auVar5 = vmovshdup_avx(auVar5);
  fVar6 = auVar5._0_4_ * (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  iVar11 = (int)fVar19;
  if (iVar13 + -2 < iVar11) {
    iVar11 = iVar13 + -2;
  }
  iVar14 = (int)fVar6;
  if (iVar3 < iVar14) {
    iVar14 = iVar3;
  }
  size = iVar2 * iVar13;
  fVar19 = fVar19 - (float)iVar11;
  fVar6 = fVar6 - (float)iVar14;
  uVar12 = iVar11 + size * iVar9 + iVar14 * iVar13;
  fVar15 = lookup<2UL,_0>(this,(this->m_data).ptr,uVar12,size,local_68);
  fVar16 = lookup<2UL,_0>(this,(this->m_data).ptr + 1,uVar12,size,local_68);
  fVar17 = lookup<2UL,_0>(this,(this->m_data).ptr +
                               (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,uVar12,size,
                          local_68);
  fVar18 = lookup<2UL,_0>(this,(this->m_data).ptr +
                               (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + 1,uVar12,
                          size,local_68);
  local_78._0_4_ = 1.0 - fVar6;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar18)),ZEXT416((uint)local_78._0_4_),
                           ZEXT416((uint)fVar16));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar17)),ZEXT416((uint)local_78._0_4_),
                            ZEXT416((uint)fVar15));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * auVar5._0_4_)),auVar20,
                           ZEXT416((uint)(1.0 - fVar19)));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(auVar5._0_4_ - auVar20._0_4_)),
                           ZEXT416((uint)(fVar19 * 0.5)),auVar20);
  fVar15 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr,uVar12,size,local_68);
  fVar16 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr +
                               (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,uVar12,size,
                          local_68);
  iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar6)),ZEXT416((uint)fVar15),
                            ZEXT416((uint)local_78._0_4_));
  iVar13 = iVar3 * iVar14 + size * iVar9;
  fVar15 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr,iVar3 + -1 + iVar13,size,local_68);
  fVar16 = lookup<2UL,_0>(this,(this->m_conditional_cdf).ptr,
                          iVar13 + -1 + (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x * 2,size,
                          local_68);
  uVar12 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar16)),ZEXT416((uint)fVar15),
                           ZEXT416((uint)local_78._0_4_));
  local_78 = ZEXT416((uint)((auVar20._0_4_ + fVar19 * auVar5._0_4_) / auVar8._0_4_));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 - fVar15)),ZEXT416((uint)(fVar6 * 0.5)),
                           ZEXT416((uint)fVar15));
  fVar19 = lookup<2UL,_0>(this,(this->m_marginal_cdf).ptr,iVar9 * uVar12 + iVar14,uVar12,local_68);
  auVar5 = vinsertps_avx(local_78,ZEXT416((uint)(fVar19 + fVar6 * auVar5._0_4_)),0x10);
  PVar21.p.super_Tuple2<pbrt::Vector2,_float> = auVar5._0_8_;
  PVar21.pdf = (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
               (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y * auVar7._0_4_;
  return PVar21;
}

Assistant:

PBRT_CPU_GPU
    PLSample Invert(Vector2f sample, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Fetch values at corners of bilinear patch */
        sample.x *= m_inv_patch_size.x;
        sample.y *= m_inv_patch_size.y;
        Vector2i pos = Min(Vector2i(sample), m_size - Vector2i(2, 2));
        sample -= Vector2f(pos);

        uint32_t offset = pos.x + pos.y * m_size.x;
        uint32_t slice_size = HProd(m_size);
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        /* Invert the X component */
        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight);

        Vector2f w1 = sample, w0 = Vector2f(1, 1) - w1;

        float c0 = std::fma(w0.y, v00, w1.y * v01), c1 = std::fma(w0.y, v10, w1.y * v11),
              pdf = std::fma(w0.x, c0, w1.x * c1);

        sample.x *= c0 + .5f * sample.x * (c1 - c0);

        float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset, slice_size,
                                     param_weight),
              v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x, offset,
                                     slice_size, param_weight);

        sample.x += (1.f - sample.y) * v0 + sample.y * v1;

        offset = pos.y * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        sample.x /= (1.f - sample.y) * r0 + sample.y * r1;

        /* Invert the Y component */
        sample.y *= r0 + .5f * sample.y * (r1 - r0);

        offset = pos.y;
        if (Dimension != 0)
            offset += slice_offset * m_size.y;

        sample.y +=
            lookup<Dimension>(m_marginal_cdf.data(), offset, m_size.y, param_weight);

        return {sample, pdf * HProd(m_inv_patch_size)};
    }